

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::Image(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,ImVec4 *tint_col,
                 ImVec4 *border_col)

{
  ImGuiWindow *pIVar1;
  ImRect *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 IVar5;
  ImRect *p_min;
  ImDrawList *this;
  ImRect local_58;
  ImVec2 *local_48;
  ImRect local_40;
  
  pIVar3 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar1 = pIVar3->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    local_58.Min.x = (pIVar1->DC).CursorPos.x;
    local_58.Min.y = (pIVar1->DC).CursorPos.y;
    local_58.Max.x = (*size).x + local_58.Min.x;
    local_58.Max.y = (*size).y + local_58.Min.y;
    if (0.0 < border_col->w) {
      local_58.Max.x = local_58.Max.x + 2.0;
      local_58.Max.y = local_58.Max.y + 2.0;
    }
    local_40.Min.x = local_58.Max.x - local_58.Min.x;
    local_40.Min.y = local_58.Max.y - local_58.Min.y;
    ItemSize(&local_40.Min,-1.0);
    bVar4 = ItemAdd(&local_58,0,(ImRect *)0x0,0);
    if (bVar4) {
      this = pIVar1->DrawList;
      local_48 = uv1;
      if (border_col->w <= 0.0) {
        IVar5 = GetColorU32(tint_col);
        p_min = &local_58;
        pIVar2 = &local_58;
      }
      else {
        IVar5 = GetColorU32(border_col);
        ImDrawList::AddRect(this,&local_58.Min,&local_58.Max,IVar5,0.0,0,1.0);
        this = pIVar1->DrawList;
        local_40.Min.x = local_58.Min.x + 1.0;
        local_40.Min.y = local_58.Min.y + 1.0;
        p_min = &local_40;
        local_40.Max.x = local_58.Max.x + -1.0;
        local_40.Max.y = local_58.Max.y + -1.0;
        pIVar2 = &local_40;
        IVar5 = GetColorU32(tint_col);
      }
      ImDrawList::AddImage(this,user_texture_id,&p_min->Min,&pIVar2->Max,uv0,local_48,IVar5);
    }
  }
  return;
}

Assistant:

void ImGui::Image(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec4& tint_col, const ImVec4& border_col)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    if (border_col.w > 0.0f)
        bb.Max += ImVec2(2, 2);
    ItemSize(bb);
    if (!ItemAdd(bb, 0))
        return;

    if (border_col.w > 0.0f)
    {
        window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(border_col), 0.0f);
        window->DrawList->AddImage(user_texture_id, bb.Min + ImVec2(1, 1), bb.Max - ImVec2(1, 1), uv0, uv1, GetColorU32(tint_col));
    }
    else
    {
        window->DrawList->AddImage(user_texture_id, bb.Min, bb.Max, uv0, uv1, GetColorU32(tint_col));
    }
}